

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::ReadHexDigits(char *ptr,int len,uint32 *result)

{
  uint32 uVar1;
  int iVar2;
  char *end;
  uint32 *result_local;
  char *pcStack_18;
  int len_local;
  char *ptr_local;
  
  *result = 0;
  if (len == 0) {
    ptr_local._7_1_ = false;
  }
  else {
    for (pcStack_18 = ptr; pcStack_18 < ptr + len; pcStack_18 = pcStack_18 + 1) {
      if (*pcStack_18 == '\0') {
        return false;
      }
      uVar1 = *result;
      iVar2 = anon_unknown_4::DigitValue(*pcStack_18);
      *result = uVar1 * 0x10 + iVar2;
    }
    ptr_local._7_1_ = true;
  }
  return ptr_local._7_1_;
}

Assistant:

static bool ReadHexDigits(const char* ptr, int len, uint32* result) {
  *result = 0;
  if (len == 0) return false;
  for (const char* end = ptr + len; ptr < end; ++ptr) {
    if (*ptr == '\0') return false;
    *result = (*result << 4) + DigitValue(*ptr);
  }
  return true;
}